

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjInitFromInt(jx9_vm *pVm,jx9_value *pObj,sxi64 iVal)

{
  sxi64 iVal_local;
  jx9_value *pObj_local;
  jx9_vm *pVm_local;
  
  SyZero(pObj,0x40);
  pObj->pVm = pVm;
  SyBlobInit(&pObj->sBlob,&pVm->sAllocator);
  (pObj->x).iVal = iVal;
  pObj->iFlags = 2;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInitFromInt(jx9_vm *pVm, jx9_value *pObj, sxi64 iVal)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	/* Set the desired type */
	pObj->x.iVal = iVal;
	pObj->iFlags = MEMOBJ_INT;
	return SXRET_OK;
}